

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void proto2_unittest::TestNestedRequiredForeign::SharedDtor(MessageLite *self)

{
  TestNestedRequiredForeign *this;
  TestRequiredForeign *this_00;
  TestRequiredEnum *this_01;
  TestRequiredEnumNoMask *this_02;
  TestRequiredEnumMulti *this_03;
  TestRequiredNoMaskMulti *this_04;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  TestNestedRequiredForeign *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (TestNestedRequiredForeign *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar1 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    this = (TestNestedRequiredForeign *)local_18[1]._internal_metadata_.ptr_;
    if (this != (TestNestedRequiredForeign *)0x0) {
      ~TestNestedRequiredForeign(this);
      operator_delete(this,0x50);
    }
    this_00 = (TestRequiredForeign *)local_18[2]._vptr_MessageLite;
    if (this_00 != (TestRequiredForeign *)0x0) {
      TestRequiredForeign::~TestRequiredForeign(this_00);
      operator_delete(this_00,0x48);
    }
    this_01 = (TestRequiredEnum *)local_18[2]._internal_metadata_.ptr_;
    if (this_01 != (TestRequiredEnum *)0x0) {
      TestRequiredEnum::~TestRequiredEnum(this_01);
      operator_delete(this_01,0x20);
    }
    this_02 = (TestRequiredEnumNoMask *)local_18[3]._vptr_MessageLite;
    if (this_02 != (TestRequiredEnumNoMask *)0x0) {
      TestRequiredEnumNoMask::~TestRequiredEnumNoMask(this_02);
      operator_delete(this_02,0x20);
    }
    this_03 = (TestRequiredEnumMulti *)local_18[3]._internal_metadata_.ptr_;
    if (this_03 != (TestRequiredEnumMulti *)0x0) {
      TestRequiredEnumMulti::~TestRequiredEnumMulti(this_03);
      operator_delete(this_03,0x28);
    }
    this_04 = (TestRequiredNoMaskMulti *)local_18[4]._vptr_MessageLite;
    if (this_04 != (TestRequiredNoMaskMulti *)0x0) {
      TestRequiredNoMaskMulti::~TestRequiredNoMaskMulti(this_04);
      operator_delete(this_04,0x38);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
             ,0x4d79,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void TestNestedRequiredForeign::SharedDtor(MessageLite& self) {
  TestNestedRequiredForeign& this_ = static_cast<TestNestedRequiredForeign&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.child_;
  delete this_._impl_.payload_;
  delete this_._impl_.required_enum_;
  delete this_._impl_.required_enum_no_mask_;
  delete this_._impl_.required_enum_multi_;
  delete this_._impl_.required_no_mask_;
  this_._impl_.~Impl_();
}